

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O2

UCVarValue FBaseCVar::FromInt(int value,ECVarType type)

{
  UCVarValue ret;
  
  switch(type) {
  case CVAR_Bool:
    ret.Bool = value != 0;
    break;
  case CVAR_Int:
    ret.Int = value;
    break;
  case CVAR_Float:
    ret.Float = (float)value;
    break;
  case CVAR_String:
    mysnprintf(cstrbuf,0x28,"%i");
    ret.String = cstrbuf;
    break;
  case CVAR_GUID:
    ret.String = (char *)0x0;
  }
  return (UCVarValue)ret.String;
}

Assistant:

UCVarValue FBaseCVar::FromInt (int value, ECVarType type)
{
	UCVarValue ret;

	switch (type)
	{
	case CVAR_Bool:
		ret.Bool = value != 0;
		break;

	case CVAR_Int:
		ret.Int = value;
		break;

	case CVAR_Float:
		ret.Float = (float)value;
		break;

	case CVAR_String:
		mysnprintf (cstrbuf, countof(cstrbuf), "%i", value);
		ret.String = cstrbuf;
		break;

	case CVAR_GUID:
		ret.pGUID = NULL;
		break;

	default:
		break;
	}

	return ret;
}